

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O3

QP2PassNodeResult __thiscall mp::QP2PassVisitor::VisitSum(QP2PassVisitor *this,SumExpr expr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = *(int *)((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase
                         .impl_ + 4);
  if ((long)iVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    lVar4 = 8;
    do {
      iVar3 = BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes>::Visit
                        ((BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes> *)this,
                         (Expr)((ExprBase *)
                               ((long)expr.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                      super_ExprBase.impl_ + lVar4))->impl_);
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = iVar3;
    } while ((iVar2 <= this->mode_) && (bVar5 = (long)iVar1 * 8 != lVar4, lVar4 = lVar4 + 8, bVar5))
    ;
  }
  return iVar2;
}

Assistant:

void QP2PassVisitor::DoAddConst(long double c) {
  if (GetPAffineExpr()) {
    GetPAffineExpr()->add_to_constant(c);
  } else {
    if (2==pass_)
      const_term_ += c;
  }
}